

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

void tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  opj_tgt_node *poVar5;
  opj_tgt_node_t *stk [31];
  long local_128 [31];
  
  plVar4 = local_128;
  poVar5 = tree->nodes + leafno;
  for (poVar1 = tree->nodes[leafno].parent; poVar1 != (opj_tgt_node *)0x0; poVar1 = poVar1->parent)
  {
    *plVar4 = (long)poVar5;
    plVar4 = plVar4 + 1;
    poVar5 = poVar1;
  }
  iVar3 = 0;
  do {
    iVar2 = poVar5->low;
    if (poVar5->low < iVar3) {
      poVar5->low = iVar3;
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    if (iVar2 < threshold) {
      do {
        if (poVar5->value <= iVar2) {
          iVar3 = iVar2;
          if (poVar5->known == 0) {
            bio_write(bio,1,1);
            poVar5->known = 1;
          }
          break;
        }
        bio_write(bio,0,1);
        iVar2 = iVar2 + 1;
        iVar3 = threshold;
      } while (threshold != iVar2);
    }
    poVar5->low = iVar3;
    if (plVar4 == local_128) {
      return;
    }
    poVar5 = (opj_tgt_node *)plVar4[-1];
    plVar4 = plVar4 + -1;
  } while( true );
}

Assistant:

void tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 threshold) {
	opj_tgt_node_t *stk[31];
	opj_tgt_node_t **stkptr;
	opj_tgt_node_t *node;
	OPJ_INT32 low;

	stkptr = stk;
	node = &tree->nodes[leafno];
	while (node->parent) {
		*stkptr++ = node;
		node = node->parent;
	}
	
	low = 0;
	for (;;) {
		if (low > node->low) {
			node->low = low;
		} else {
			low = node->low;
		}
		
		while (low < threshold) {
			if (low >= node->value) {
				if (!node->known) {
					bio_write(bio, 1, 1);
					node->known = 1;
				}
				break;
			}
			bio_write(bio, 0, 1);
			++low;
		}
		
		node->low = low;
		if (stkptr == stk)
			break;
		node = *--stkptr;
	}
}